

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLCellLinOp::applyBC
          (MLCellLinOp *this,int amrlev,int mglev,MultiFab *in,BCMode bc_mode,StateMode param_6,
          MLMGBndry *bndry,bool skip_fillboundary)

{
  value_type_conflict1 vVar1;
  value_type_conflict1 vVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Geometry *this_00;
  IntVect *pIVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  int *piVar11;
  long lVar12;
  MLLinOp *in_RDI;
  int in_R8D;
  Periodicity PVar13;
  IntVect IVar14;
  long in_stack_00000008;
  byte in_stack_00000010;
  Real bclhi;
  Real bcllo;
  BoundCond bcthi;
  BoundCond bctlo;
  int icomp;
  Array4<const_double> *bvhi;
  Array4<const_double> *bvlo;
  Array4<const_int> *mhi;
  Array4<const_int> *mlo;
  int blen;
  Box bhi;
  Box blo;
  Orientation ohi;
  Orientation olo;
  int idim;
  Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
  *bdcv;
  Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_> *bdlv;
  Array4<double> *iofab;
  Box *vbx;
  MFIter mfi;
  int hidden_direction;
  MFItInfo mfi_info;
  Array4<const_double> *foo;
  FArrayBox foofab;
  BndryCondLoc *bcondloc;
  array<amrex::MultiMask,_6UL> *maskvals;
  Real dzi;
  Real dyi;
  Real dxi;
  Real *dxinv;
  int imaxorder;
  int flagbc;
  int tensorop;
  int cross;
  int ncomp;
  IndexType typ;
  int sm;
  IntVect hi;
  IntVect low;
  IndexType typ_1;
  int bg;
  uint bitval;
  IntVect hi_1;
  IntVect low_1;
  int m_1;
  Real tmp_1;
  int j_7;
  int k_5;
  GpuArray<double,_4U> coef_1;
  GpuArray<double,_4U> x_1;
  int NX_1;
  int j_5;
  int k_4;
  int j_4;
  int k_3;
  int s_1;
  int i_2;
  Dim3 hi_3;
  Dim3 lo_1;
  int m;
  Real tmp;
  int j_3;
  int k_2;
  GpuArray<double,_4U> coef;
  GpuArray<double,_4U> x;
  int NX;
  int j_1;
  int k_1;
  int j;
  int k;
  int s;
  int i;
  Dim3 hi_2;
  Dim3 lo;
  int m_3;
  Real tmp_3;
  int i_11;
  int k_11;
  GpuArray<double,_4U> coef_3;
  GpuArray<double,_4U> x_3;
  int NX_3;
  int i_9;
  int k_10;
  int i_8;
  int k_9;
  int s_3;
  int j_10;
  Dim3 hi_5;
  Dim3 lo_3;
  int m_2;
  Real tmp_2;
  int i_7;
  int k_8;
  GpuArray<double,_4U> coef_2;
  GpuArray<double,_4U> x_2;
  int NX_2;
  int i_5;
  int k_7;
  int i_4;
  int k_6;
  int s_2;
  int j_8;
  Dim3 hi_4;
  Dim3 lo_2;
  int m_5;
  Real tmp_5;
  int i_19;
  int j_19;
  GpuArray<double,_4U> coef_5;
  GpuArray<double,_4U> x_5;
  int NX_5;
  int i_17;
  int j_17;
  int i_16;
  int j_16;
  int s_5;
  int k_13;
  Dim3 hi_7;
  Dim3 lo_5;
  int m_4;
  Real tmp_4;
  int i_15;
  int j_15;
  GpuArray<double,_4U> coef_4;
  GpuArray<double,_4U> x_4;
  int NX_4;
  int i_13;
  int j_13;
  int i_12;
  int j_12;
  int s_4;
  int k_12;
  Dim3 hi_6;
  Dim3 lo_4;
  int i_14;
  Real den_4;
  Real num_4;
  int j_14;
  int i_18;
  Real den_5;
  Real num_5;
  int j_18;
  int i_6;
  Real den_2;
  Real num_2;
  int j_9;
  int i_10;
  Real den_3;
  Real num_3;
  int j_11;
  int i_1;
  Real den;
  Real num;
  int j_2;
  int i_3;
  Real den_1;
  Real num_1;
  int j_6;
  BndryData *in_stack_ffffffffffffe508;
  BndryCondLoc *in_stack_ffffffffffffe510;
  undefined4 in_stack_ffffffffffffe518;
  int in_stack_ffffffffffffe51c;
  MFIter *in_stack_ffffffffffffe520;
  int in_stack_ffffffffffffe528;
  int in_stack_ffffffffffffe52c;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe530;
  undefined4 in_stack_ffffffffffffe538;
  undefined4 in_stack_ffffffffffffe53c;
  Geometry *in_stack_ffffffffffffe540;
  int local_19f0;
  long local_19e8 [8];
  long *local_19a8;
  int local_199c;
  long local_1998 [8];
  long *local_1958;
  long local_1950 [8];
  long *local_1910;
  long local_1908 [6];
  char *in_stack_ffffffffffffe728;
  int in_stack_ffffffffffffe734;
  char *in_stack_ffffffffffffe738;
  long *plVar15;
  undefined4 in_stack_ffffffffffffe740;
  int in_stack_ffffffffffffe744;
  int local_18b8;
  int iStack_18b4;
  int iStack_18b0;
  int local_18ac;
  int iStack_18a8;
  Box local_18a0;
  Orientation local_1884;
  Orientation local_1880;
  uint local_187c;
  Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
  *local_1878;
  Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_> *local_1870;
  long local_1868 [8];
  long *local_1828;
  Box local_181c;
  Box *local_1800;
  MFIter local_17f8;
  uint local_1798;
  MFItInfo local_1784;
  Array4<const_double> local_1770;
  Array4<const_double> *local_1730;
  undefined1 local_1708 [16];
  double *local_16f8;
  undefined1 auStack_16f0 [12];
  int iStack_16e4;
  int local_16e0;
  int iStack_16dc;
  int local_16d4;
  type local_16c0;
  array<amrex::MultiMask,_6UL> *local_16b8;
  Real local_16b0;
  Real local_16a8;
  Real local_16a0;
  Real *local_1698;
  int local_1690;
  uint local_168c;
  IntVect local_1688;
  undefined8 local_1674;
  int local_166c;
  uint local_1668;
  uint local_1664;
  int local_1660;
  byte local_1659;
  int local_1654;
  char *local_1638;
  undefined4 local_162c;
  char *local_1628;
  char *local_1620;
  uint local_1614;
  uint local_1610;
  int local_160c;
  IntVect local_1608;
  IntVect local_15f8;
  int local_15e8;
  uint local_15e4;
  Box *local_15e0;
  uint local_15d4;
  IntVect *local_15d0;
  uint local_15c4;
  uint local_15c0;
  int local_15bc;
  int local_15b8 [3];
  undefined8 local_15a8;
  int local_15a0;
  uint local_159c;
  IntVect local_1598;
  IntVect local_1588;
  int local_1578;
  uint local_1574;
  Box *local_1570;
  uint local_1564;
  IntVect *local_1560;
  uint local_1554;
  undefined8 *local_1550;
  undefined1 *local_1548;
  int local_153c;
  double local_1538;
  int local_1530;
  int local_152c;
  double local_1528 [8];
  int local_14e8;
  int local_14e4;
  int local_14e0;
  int local_14dc;
  int local_14d8;
  int local_14d4;
  int local_14d0;
  int local_14cc;
  int iStack_14b4;
  int local_14b0;
  int iStack_1494;
  int local_1490;
  int local_1488;
  uint local_1484;
  Real local_1480;
  int local_1474;
  long *local_1470;
  value_type_conflict1 local_1468;
  long *local_1460;
  long *local_1458;
  int local_144c;
  undefined1 *local_1448;
  undefined4 local_1440;
  BoundCond local_143c [5];
  undefined1 *local_1428;
  undefined1 *local_1400;
  int local_13e8;
  int local_13e4;
  int local_13e0;
  int local_13dc;
  long *local_13d8;
  int local_13d0;
  int local_13cc;
  int local_13c8;
  int local_13c4;
  long *local_13c0;
  int local_13b8;
  int local_13b4;
  int local_13b0;
  int local_13ac;
  long *local_13a8;
  int local_13a0;
  int local_139c;
  int local_1398;
  int local_1394;
  long *local_1390;
  int local_1388;
  int local_1384;
  int local_1380;
  int local_137c;
  long *local_1378;
  int local_1370;
  int local_136c;
  int local_1368;
  int local_1364;
  long *local_1360;
  int local_1358;
  int local_1354;
  int local_1350;
  int local_134c;
  long *local_1348;
  int local_1340;
  int local_133c;
  int local_1338;
  int local_1334;
  long *local_1330;
  undefined4 local_1324;
  int *local_1320;
  undefined4 local_1314;
  int *local_1310;
  undefined4 local_1304;
  int *local_1300;
  undefined4 local_12f4;
  undefined1 *local_12f0;
  undefined4 local_12e4;
  undefined1 *local_12e0;
  undefined4 local_12d4;
  undefined1 *local_12d0;
  int local_12c4;
  double local_12c0;
  int local_12b8;
  int local_12b4;
  double local_12b0 [8];
  int local_1270;
  int local_126c;
  int local_1268;
  int local_1264;
  int local_1260;
  int local_125c;
  int local_1258;
  int local_1254;
  int iStack_123c;
  int local_1238;
  int iStack_121c;
  int local_1218;
  int local_1210;
  uint local_120c;
  Real local_1208;
  int local_11fc;
  long *local_11f8;
  value_type_conflict1 local_11f0;
  long *local_11e8;
  long *local_11e0;
  int local_11d4;
  Box *local_11d0;
  undefined4 local_11c8;
  BoundCond local_11c4 [5];
  Box *local_11b0;
  Box *local_1188;
  int local_1170;
  int local_116c;
  int local_1168;
  int local_1164;
  long *local_1160;
  int local_1158;
  int local_1154;
  int local_1150;
  int local_114c;
  long *local_1148;
  int local_1140;
  int local_113c;
  int local_1138;
  int local_1134;
  long *local_1130;
  int local_1128;
  int local_1124;
  int local_1120;
  int local_111c;
  long *local_1118;
  int local_1110;
  int local_110c;
  int local_1108;
  int local_1104;
  long *local_1100;
  int local_10f8;
  int local_10f4;
  int local_10f0;
  int local_10ec;
  long *local_10e8;
  int local_10e0;
  int local_10dc;
  int local_10d8;
  int local_10d4;
  long *local_10d0;
  int local_10c8;
  int local_10c4;
  int local_10c0;
  int local_10bc;
  long *local_10b8;
  undefined4 local_10ac;
  IntVect *local_10a8;
  undefined4 local_109c;
  IntVect *local_1098;
  undefined4 local_108c;
  IntVect *local_1088;
  undefined4 local_107c;
  Box *local_1078;
  undefined4 local_106c;
  Box *local_1068;
  undefined4 local_105c;
  Box *local_1058;
  int local_104c;
  double local_1048;
  int local_1040;
  int local_103c;
  double local_1038 [8];
  int local_ff8;
  int local_ff4;
  int local_ff0;
  int local_fec;
  int local_fe8;
  int local_fe4;
  int local_fe0;
  int local_fdc;
  int local_fc8;
  int local_fc0;
  int local_fa8;
  int local_fa0;
  int local_f98;
  uint local_f94;
  Real local_f90;
  int local_f84;
  long *local_f80;
  value_type_conflict1 local_f78;
  long *local_f70;
  long *local_f68;
  int local_f5c;
  undefined1 *local_f58;
  undefined4 local_f50;
  BoundCond local_f4c [5];
  undefined1 *local_f38;
  undefined1 *local_f10;
  int local_ef8;
  int local_ef4;
  int local_ef0;
  int local_eec;
  long *local_ee8;
  int local_ee0;
  int local_edc;
  int local_ed8;
  int local_ed4;
  long *local_ed0;
  int local_ec8;
  int local_ec4;
  int local_ec0;
  int local_ebc;
  long *local_eb8;
  int local_eb0;
  int local_eac;
  int local_ea8;
  int local_ea4;
  long *local_ea0;
  int local_e98;
  int local_e94;
  int local_e90;
  int local_e8c;
  long *local_e88;
  int local_e80;
  int local_e7c;
  int local_e78;
  int local_e74;
  long *local_e70;
  int local_e68;
  int local_e64;
  int local_e60;
  int local_e5c;
  long *local_e58;
  int local_e50;
  int local_e4c;
  int local_e48;
  int local_e44;
  long *local_e40;
  undefined4 local_e34;
  int *local_e30;
  undefined4 local_e24;
  int *local_e20;
  undefined4 local_e14;
  int *local_e10;
  undefined4 local_e04;
  undefined1 *local_e00;
  undefined4 local_df4;
  undefined1 *local_df0;
  undefined4 local_de4;
  undefined1 *local_de0;
  int local_dd4;
  double local_dd0;
  int local_dc8;
  int local_dc4;
  double local_dc0 [8];
  int local_d80;
  int local_d7c;
  int local_d78;
  int local_d74;
  int local_d70;
  int local_d6c;
  int local_d68;
  int local_d64;
  int local_d50;
  int local_d48;
  int local_d30;
  int local_d28;
  int local_d20;
  uint local_d1c;
  Real local_d18;
  int local_d0c;
  long *local_d08;
  value_type_conflict1 local_d00;
  long *local_cf8;
  long *local_cf0;
  int local_ce4;
  Box *local_ce0;
  undefined4 local_cd8;
  BoundCond local_cd4 [5];
  Box *local_cc0;
  Box *local_c98;
  int local_c80;
  int local_c7c;
  int local_c78;
  int local_c74;
  long *local_c70;
  int local_c68;
  int local_c64;
  int local_c60;
  int local_c5c;
  long *local_c58;
  int local_c50;
  int local_c4c;
  int local_c48;
  int local_c44;
  long *local_c40;
  int local_c38;
  int local_c34;
  int local_c30;
  int local_c2c;
  long *local_c28;
  int local_c20;
  int local_c1c;
  int local_c18;
  int local_c14;
  long *local_c10;
  int local_c08;
  int local_c04;
  int local_c00;
  int local_bfc;
  long *local_bf8;
  int local_bf0;
  int local_bec;
  int local_be8;
  int local_be4;
  long *local_be0;
  int local_bd8;
  int local_bd4;
  int local_bd0;
  int local_bcc;
  long *local_bc8;
  undefined4 local_bbc;
  IntVect *local_bb8;
  undefined4 local_bac;
  IntVect *local_ba8;
  undefined4 local_b9c;
  IntVect *local_b98;
  undefined4 local_b8c;
  Box *local_b88;
  undefined4 local_b7c;
  Box *local_b78;
  undefined4 local_b6c;
  Box *local_b68;
  int local_b5c;
  double local_b58;
  int local_b50;
  int local_b4c;
  double local_b48 [8];
  int local_b08;
  int local_b04;
  int local_b00;
  int local_afc;
  int local_af8;
  int local_af4;
  int local_af0;
  int local_aec;
  int local_ad8;
  int iStack_ad4;
  int local_ab8;
  int iStack_ab4;
  int local_aa8;
  uint local_aa4;
  Real local_aa0;
  int local_a94;
  long *local_a90;
  value_type_conflict1 local_a88;
  long *local_a80;
  long *local_a78;
  int local_a6c;
  undefined1 *local_a68;
  undefined4 local_a60;
  BoundCond local_a5c [5];
  undefined1 *local_a48;
  undefined1 *local_a20;
  int local_a08;
  int local_a04;
  int local_a00;
  int local_9fc;
  long *local_9f8;
  int local_9f0;
  int local_9ec;
  int local_9e8;
  int local_9e4;
  long *local_9e0;
  int local_9d8;
  int local_9d4;
  int local_9d0;
  int local_9cc;
  long *local_9c8;
  int local_9c0;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  long *local_9b0;
  int local_9a8;
  int local_9a4;
  int local_9a0;
  int local_99c;
  long *local_998;
  int local_990;
  int local_98c;
  int local_988;
  int local_984;
  long *local_980;
  int local_978;
  int local_974;
  int local_970;
  int local_96c;
  long *local_968;
  int local_960;
  int local_95c;
  int local_958;
  int local_954;
  long *local_950;
  undefined4 local_944;
  int *local_940;
  undefined4 local_934;
  int *local_930;
  undefined4 local_924;
  int *local_920;
  undefined4 local_914;
  undefined1 *local_910;
  undefined4 local_904;
  undefined1 *local_900;
  undefined4 local_8f4;
  undefined1 *local_8f0;
  int local_8e4;
  double local_8e0;
  int local_8d8;
  int local_8d4;
  double local_8d0 [8];
  int local_890;
  int local_88c;
  int local_888;
  int local_884;
  int local_880;
  int local_87c;
  int local_878;
  int local_874;
  int local_860;
  int iStack_85c;
  int local_840;
  int iStack_83c;
  int local_830;
  uint local_82c;
  Real local_828;
  int local_81c;
  long *local_818;
  value_type_conflict1 local_810;
  long *local_808;
  long *local_800;
  int local_7f4;
  Box *local_7f0;
  undefined4 local_7e8;
  BoundCond local_7e4 [5];
  Box *local_7d0;
  Box *local_7a8;
  int local_790;
  int local_78c;
  int local_788;
  int local_784;
  long *local_780;
  int local_778;
  int local_774;
  int local_770;
  int local_76c;
  long *local_768;
  int local_760;
  int local_75c;
  int local_758;
  int local_754;
  long *local_750;
  int local_748;
  int local_744;
  int local_740;
  int local_73c;
  long *local_738;
  int local_730;
  int local_72c;
  int local_728;
  int local_724;
  long *local_720;
  int local_718;
  int local_714;
  int local_710;
  int local_70c;
  long *local_708;
  int local_700;
  int local_6fc;
  int local_6f8;
  int local_6f4;
  long *local_6f0;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  long *local_6d8;
  undefined4 local_6cc;
  IntVect *local_6c8;
  undefined4 local_6bc;
  IntVect *local_6b8;
  undefined4 local_6ac;
  IntVect *local_6a8;
  undefined4 local_69c;
  Box *local_698;
  undefined4 local_68c;
  Box *local_688;
  undefined4 local_67c;
  Box *local_678;
  char *local_670;
  int local_660;
  int local_65c;
  long *local_658;
  int local_648;
  int local_644;
  long *local_640;
  int local_630;
  int local_62c;
  long *local_628;
  int local_618;
  int local_614;
  long *local_610;
  int local_600;
  int local_5fc;
  long *local_5f8;
  int local_5e8;
  int local_5e4;
  long *local_5e0;
  int local_5d4;
  int local_5cc;
  long *local_5c8;
  int local_5bc;
  int local_5b4;
  long *local_5b0;
  int local_5a4;
  int local_59c;
  long *local_598;
  int local_58c;
  int local_584;
  long *local_580;
  int local_574;
  int local_56c;
  long *local_568;
  int local_55c;
  int local_554;
  long *local_550;
  int local_544;
  int local_540;
  long *local_538;
  int local_52c;
  int local_528;
  long *local_520;
  int local_514;
  int local_510;
  long *local_508;
  int local_4fc;
  int local_4f8;
  long *local_4f0;
  int local_4e4;
  int local_4e0;
  long *local_4d8;
  int local_4cc;
  int local_4c8;
  long *local_4c0;
  int local_4b8;
  uint local_4b4;
  IntVect *local_4b0;
  int local_4a8;
  uint local_4a4;
  IntVect *local_4a0;
  int local_498;
  uint local_494;
  IntVect *local_490;
  int local_488;
  uint local_484;
  IntVect *local_480;
  uint local_474;
  uint *local_470;
  uint local_468;
  uint local_464;
  uint *local_460;
  uint local_454;
  int *local_450;
  int *local_448;
  int *local_440;
  int *local_438;
  int *local_430;
  int *local_428;
  int *local_420;
  int *local_418;
  int *local_410;
  int *local_408;
  int *local_400;
  int *local_3f8;
  int local_3ec;
  double local_3e8;
  double local_3e0;
  int local_3d4;
  double *local_3d0;
  int local_3c4;
  double *local_3c0;
  undefined8 local_3b8;
  int local_3ac;
  double local_3a8;
  double local_3a0;
  int local_394;
  double *local_390;
  int local_384;
  double *local_380;
  undefined8 local_378;
  int local_36c;
  double local_368;
  double local_360;
  int local_354;
  double *local_350;
  int local_344;
  double *local_340;
  undefined8 local_338;
  int local_32c;
  double local_328;
  double local_320;
  int local_314;
  double *local_310;
  int local_304;
  double *local_300;
  undefined8 local_2f8;
  int local_2ec;
  double local_2e8;
  double local_2e0;
  int local_2d4;
  double *local_2d0;
  int local_2c4;
  double *local_2c0;
  undefined8 local_2b8;
  int local_2ac;
  double local_2a8;
  double local_2a0;
  int local_294;
  double *local_290;
  int local_284;
  double *local_280;
  undefined8 local_278;
  int local_26c;
  double *local_268;
  undefined4 local_25c;
  double *local_258;
  undefined4 local_24c;
  double *local_248;
  undefined4 local_23c;
  double *local_238;
  int local_22c;
  double *local_228;
  undefined4 local_21c;
  double *local_218;
  undefined4 local_20c;
  double *local_208;
  undefined4 local_1fc;
  double *local_1f8;
  int local_1ec;
  double *local_1e8;
  undefined4 local_1dc;
  double *local_1d8;
  undefined4 local_1cc;
  double *local_1c8;
  undefined4 local_1bc;
  double *local_1b8;
  int local_1ac;
  double *local_1a8;
  undefined4 local_19c;
  double *local_198;
  undefined4 local_18c;
  double *local_188;
  undefined4 local_17c;
  double *local_178;
  int local_16c;
  double *local_168;
  undefined4 local_15c;
  double *local_158;
  undefined4 local_14c;
  double *local_148;
  undefined4 local_13c;
  double *local_138;
  int local_12c;
  double *local_128;
  undefined4 local_11c;
  double *local_118;
  undefined4 local_10c;
  double *local_108;
  undefined4 local_fc;
  double *local_f8;
  Dim3 local_f0;
  Dim3 local_dc [2];
  Dim3 local_c0;
  undefined1 *local_b0;
  undefined1 *local_90;
  undefined4 local_7c;
  undefined1 *local_78;
  undefined4 local_6c;
  undefined1 *local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  Dim3 local_50;
  undefined1 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  int *local_28;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_1659 = in_stack_00000010 & 1;
  local_1654 = in_R8D;
  local_1660 = (*in_RDI->_vptr_MLLinOp[5])();
  iVar6 = (*in_RDI->_vptr_MLLinOp[0x45])();
  local_1664 = (uint)((byte)iVar6 & 1);
  iVar6 = (*in_RDI->_vptr_MLLinOp[0x46])();
  local_1668 = (uint)((byte)iVar6 & 1);
  if ((local_1659 & 1) == 0) {
    Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
    ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  *)in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
    PVar13 = Geometry::periodicity(in_stack_ffffffffffffe540);
    local_1688.vect._0_8_ = PVar13.period.vect._0_8_;
    local_1674._0_4_ = local_1688.vect[0];
    local_1674._4_4_ = local_1688.vect[1];
    local_1688.vect[2] = PVar13.period.vect[2];
    local_166c = local_1688.vect[2];
    local_1688 = PVar13.period.vect;
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (in_stack_ffffffffffffe530,in_stack_ffffffffffffe52c,in_stack_ffffffffffffe528,
               (Periodicity *)in_stack_ffffffffffffe520,
               SUB41((uint)in_stack_ffffffffffffe51c >> 0x18,0));
  }
  local_168c = (uint)(local_1654 == 1);
  local_1690 = in_RDI->maxorder;
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
  this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                       in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
  local_1698 = CoordSys::InvCellSize(&this_00->super_CoordSys);
  local_16a0 = *local_1698;
  local_16a8 = local_1698[1];
  local_16b0 = local_1698[2];
  Vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                *)in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
  local_16b8 = Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
               ::operator[]((Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                             *)in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
  Vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                *)in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
  Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                *)in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
  local_16c0 = std::
               unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
               ::operator*((unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>
                            *)in_stack_ffffffffffffe510);
  Box::TheUnitBox();
  FArrayBox::FArrayBox
            ((FArrayBox *)in_stack_ffffffffffffe520,
             (Box *)CONCAT44(in_stack_ffffffffffffe51c,in_stack_ffffffffffffe518),
             (int)((ulong)in_stack_ffffffffffffe510 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffe510 >> 0x18,0),
             SUB81((ulong)in_stack_ffffffffffffe510 >> 0x10,0),(Arena *)in_stack_ffffffffffffe508);
  local_b0 = auStack_16f0;
  local_5c = 0;
  local_6c = 1;
  local_7c = 2;
  local_8 = &iStack_16e4;
  local_c = 0;
  local_38 = iStack_16e4 + 1;
  local_18 = &iStack_16e4;
  local_1c = 1;
  iStack_34 = local_16e0 + 1;
  local_28 = &iStack_16e4;
  local_2c = 2;
  local_f0.z = iStack_16dc + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_1548 = local_1708;
  local_dc[0]._0_8_ = local_f0._0_8_;
  local_dc[0].z = local_f0.z;
  local_90 = local_b0;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<const_double>::Array4(&local_1770,local_16f8,&local_c0,local_dc,local_16d4);
  local_1730 = &local_1770;
  MFItInfo::MFItInfo((MFItInfo *)in_stack_ffffffffffffe520);
  MFItInfo::SetDynamic(&local_1784,true);
  if (((local_1664 == 0) && (local_1668 == 0)) && (bVar5 = Gpu::notInLaunchRegion(), !bVar5)) {
    local_1620 = "cross || tensorop || Gpu::notInLaunchRegion()";
    local_1628 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLCellLinOp.cpp"
    ;
    local_162c = 0x25b;
    local_1638 = "\"non-cross stencil not support for gpu\"";
    Assert_host((char *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
                in_stack_ffffffffffffe738,in_stack_ffffffffffffe734,in_stack_ffffffffffffe728);
  }
  local_1798 = MLLinOp::hiddenDirection(in_RDI);
  if ((local_1664 == 0) && (local_1668 == 0)) {
    local_670 = "amrex_mllinop_apply_bc not available when BL_NO_FORT=TRUE";
    Abort_host((char *)in_stack_ffffffffffffe520);
  }
  else {
    MFIter::MFIter((MFIter *)in_stack_ffffffffffffe540,
                   (FabArrayBase *)CONCAT44(in_stack_ffffffffffffe53c,in_stack_ffffffffffffe538),
                   (MFItInfo *)in_stack_ffffffffffffe530);
    while (bVar5 = MFIter::isValid(&local_17f8), bVar5) {
      MFIter::validbox(in_stack_ffffffffffffe520);
      local_1800 = &local_181c;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffe51c,in_stack_ffffffffffffe518),
                 (MFIter *)in_stack_ffffffffffffe510);
      local_1828 = local_1868;
      local_1870 = BndryCondLoc::bndryLocs
                             (in_stack_ffffffffffffe510,(MFIter *)in_stack_ffffffffffffe508);
      local_1878 = BndryCondLoc::bndryConds
                             (in_stack_ffffffffffffe510,(MFIter *)in_stack_ffffffffffffe508);
      for (local_187c = 0; (int)local_187c < 3; local_187c = local_187c + 1) {
        if (local_1798 != local_187c) {
          Orientation::Orientation(&local_1880,local_187c,low);
          Orientation::Orientation(&local_1884,local_187c,high);
          local_15e0 = local_1800;
          local_15e4 = local_187c;
          local_15e8 = 1;
          pIVar8 = Box::smallEnd(local_1800);
          local_15f8.vect[2] = pIVar8->vect[2];
          local_15f8.vect._0_8_ = *(undefined8 *)pIVar8->vect;
          pIVar8 = Box::bigEnd(local_15e0);
          iVar6 = pIVar8->vect[2];
          uVar4 = *(undefined8 *)pIVar8->vect;
          local_15d4 = local_15e4;
          local_160c = local_15f8.vect[(int)local_15e4];
          local_488 = local_160c - local_15e8;
          local_484 = local_15e4;
          local_15f8.vect[(int)local_15e4] = local_488;
          local_498 = local_160c + -1;
          local_494 = local_15e4;
          local_1608.vect[(int)local_15e4] = local_498;
          local_1608.vect._0_8_ = uVar4;
          local_1608.vect[2] = iVar6;
          local_15d0 = &local_15f8;
          local_490 = &local_1608;
          local_480 = &local_15f8;
          local_1614 = (uint)Box::ixType(local_15e0);
          local_460 = &local_1610;
          local_464 = local_15e4;
          local_454 = local_15e4;
          local_1614 = local_1614 & ~(1 << (local_15e4 & 0x1f));
          local_1610 = local_1614;
          Box::Box(&local_18a0,&local_15f8,&local_1608,(IndexType)local_1614);
          local_1570 = local_1800;
          local_1574 = local_187c;
          local_1578 = 1;
          pIVar8 = Box::smallEnd(local_1800);
          local_1588.vect[2] = pIVar8->vect[2];
          local_1588.vect._0_8_ = *(undefined8 *)pIVar8->vect;
          pIVar8 = Box::bigEnd(local_1570);
          local_1598.vect[2] = pIVar8->vect[2];
          local_1598.vect._0_8_ = *(undefined8 *)pIVar8->vect;
          IVar14 = Box::type((Box *)CONCAT44(in_stack_ffffffffffffe52c,in_stack_ffffffffffffe528));
          local_15b8._0_8_ = IVar14.vect._0_8_;
          local_15a8._0_4_ = local_15b8[0];
          local_15a8._4_4_ = local_15b8[1];
          local_15b8[2] = IVar14.vect[2];
          local_15a0 = local_15b8[2];
          local_1554 = local_1574;
          local_159c = *(uint *)((long)&local_15a8 + (long)(int)local_1574 * 4);
          local_1564 = local_1574;
          local_15bc = (local_1598.vect[(int)local_1574] + 1) - (local_159c & 1);
          local_4a0 = &local_1588;
          local_4a4 = local_1574;
          local_4a0->vect[(int)local_1574] = local_15bc;
          local_4b8 = local_15bc + local_1578 + -1;
          local_4b0 = &local_1598;
          local_4b4 = local_1574;
          local_4b0->vect[(int)local_1574] = local_4b8;
          local_15b8 = IVar14.vect;
          local_1560 = &local_1598;
          local_1550 = &local_15a8;
          local_4a8 = local_15bc;
          local_15c4 = (uint)Box::ixType(local_1570);
          local_470 = &local_15c0;
          local_474 = local_1574;
          local_468 = local_1574;
          local_15c4 = (1 << ((byte)local_1574 & 0x1f) ^ 0xffffffffU) & local_15c4;
          local_15c0 = local_15c4;
          Box::Box((Box *)&stack0xffffffffffffe744,&local_1588,&local_1598,(IndexType)local_15c4);
          iVar6 = Box::length(local_1800,local_187c);
          Orientation::operator_cast_to_int(&local_1880);
          std::array<amrex::MultiMask,_6UL>::operator[]
                    ((array<amrex::MultiMask,_6UL> *)in_stack_ffffffffffffe510,
                     (size_type)in_stack_ffffffffffffe508);
          MultiMask::array((MultiMask *)in_stack_ffffffffffffe510,
                           (MFIter *)in_stack_ffffffffffffe508);
          plVar15 = local_1908;
          Orientation::operator_cast_to_int(&local_1884);
          std::array<amrex::MultiMask,_6UL>::operator[]
                    ((array<amrex::MultiMask,_6UL> *)in_stack_ffffffffffffe510,
                     (size_type)in_stack_ffffffffffffe508);
          MultiMask::array((MultiMask *)in_stack_ffffffffffffe510,
                           (MFIter *)in_stack_ffffffffffffe508);
          local_1910 = local_1950;
          if (in_stack_00000008 == 0) {
            memcpy(local_1998,local_1730,0x3c);
          }
          else {
            local_199c = local_1880.val;
            BndryData::bndryValues
                      (in_stack_ffffffffffffe508,
                       (Orientation)(int)((ulong)in_stack_ffffffffffffe510 >> 0x20));
            FabSet::const_array((FabSet *)in_stack_ffffffffffffe510,
                                (MFIter *)in_stack_ffffffffffffe508);
          }
          local_1958 = local_1998;
          if (in_stack_00000008 == 0) {
            memcpy(local_19e8,local_1730,0x3c);
          }
          else {
            BndryData::bndryValues
                      (in_stack_ffffffffffffe508,
                       (Orientation)(int)((ulong)in_stack_ffffffffffffe510 >> 0x20));
            FabSet::const_array((FabSet *)in_stack_ffffffffffffe510,
                                (MFIter *)in_stack_ffffffffffffe508);
          }
          local_19a8 = local_19e8;
          for (local_19f0 = 0; local_19f0 < local_1660; local_19f0 = local_19f0 + 1) {
            Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
            ::operator[]((Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                          *)in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
            Orientation::operator_cast_to_int(&local_1880);
            pvVar9 = std::array<amrex::BoundCond,_6UL>::operator[]
                               ((array<amrex::BoundCond,_6UL> *)in_stack_ffffffffffffe510,
                                (size_type)in_stack_ffffffffffffe508);
            iVar7 = pvVar9->bctype;
            Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
            ::operator[]((Vector<std::array<amrex::BoundCond,_6UL>,_std::allocator<std::array<amrex::BoundCond,_6UL>_>_>
                          *)in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
            Orientation::operator_cast_to_int(&local_1884);
            pvVar9 = std::array<amrex::BoundCond,_6UL>::operator[]
                               ((array<amrex::BoundCond,_6UL> *)in_stack_ffffffffffffe510,
                                (size_type)in_stack_ffffffffffffe508);
            iVar3 = pvVar9->bctype;
            Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>::operator[]
                      ((Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_> *
                       )in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
            Orientation::operator_cast_to_int(&local_1880);
            pvVar10 = std::array<double,_6UL>::operator[]
                                ((array<double,_6UL> *)in_stack_ffffffffffffe510,
                                 (size_type)in_stack_ffffffffffffe508);
            vVar1 = *pvVar10;
            Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_>::operator[]
                      ((Vector<std::array<double,_6UL>,_std::allocator<std::array<double,_6UL>_>_> *
                       )in_stack_ffffffffffffe510,(size_type)in_stack_ffffffffffffe508);
            Orientation::operator_cast_to_int(&local_1884);
            pvVar10 = std::array<double,_6UL>::operator[]
                                ((array<double,_6UL> *)in_stack_ffffffffffffe510,
                                 (size_type)in_stack_ffffffffffffe508);
            vVar2 = *pvVar10;
            if (local_187c == 0) {
              local_11c8 = 0;
              local_11d0 = &local_18a0;
              local_11e0 = local_1828;
              local_11f8 = local_1958;
              local_11fc = local_1690;
              local_1208 = local_16a0;
              local_120c = local_168c;
              local_1210 = local_19f0;
              local_105c = 0;
              local_1254 = local_18a0.smallend.vect[0];
              local_106c = 1;
              iStack_121c = local_18a0.smallend.vect[1];
              local_107c = 2;
              local_1218 = local_18a0.smallend.vect[2];
              local_1088 = &local_18a0.bigend;
              local_108c = 0;
              local_1098 = &local_18a0.bigend;
              local_109c = 1;
              iStack_123c = local_18a0.bigend.vect[1];
              local_10a8 = &local_18a0.bigend;
              local_10ac = 2;
              local_1238 = local_18a0.bigend.vect[2];
              local_1258 = 1;
              local_11f0 = vVar1;
              local_11e8 = plVar15;
              local_11d4 = iVar6;
              local_11c4[0].bctype = iVar7;
              local_11b0 = local_11d0;
              local_1188 = local_11d0;
              local_1078 = local_11d0;
              local_1068 = local_11d0;
              local_1058 = local_11d0;
              iVar7 = BoundCond::operator_cast_to_int(local_11c4);
              if (iVar7 == 0x65) {
                local_1270 = local_11d4 + 1;
                local_408 = &local_1270;
                local_410 = &local_11fc;
                piVar11 = std::min<int>(local_408,local_410);
                local_126c = *piVar11;
                local_12b0[4] = -local_11f0 * local_1208;
                local_12b0[5] = 0.5;
                local_12b0[6] = 1.5;
                local_12b0[7] = 2.5;
                memset(local_12b0,0,0x20);
                local_2c0 = local_12b0 + 4;
                local_13c = 0;
                local_2d0 = local_12b0;
                local_14c = 0;
                local_2b8 = 0xbfe0000000000000;
                local_2c4 = local_126c;
                for (local_2d4 = 0; local_2d4 < local_126c; local_2d4 = local_2d4 + 1) {
                  local_2e0 = 1.0;
                  local_2e8 = 1.0;
                  for (local_2ec = 0; local_2ec < local_126c; local_2ec = local_2ec + 1) {
                    if (local_2ec != local_2d4) {
                      local_2e0 = (-0.5 - local_2c0[local_2ec]) * local_2e0;
                      local_2e8 = (local_2c0[local_2d4] - local_2c0[local_2ec]) * local_2e8;
                    }
                  }
                  local_2d0[local_2d4] = local_2e0 / local_2e8;
                }
                for (local_12b4 = local_1218; local_148 = local_2d0, local_138 = local_2c0,
                    local_12b4 <= local_1238; local_12b4 = local_12b4 + 1) {
                  for (local_12b8 = iStack_121c; local_12b8 <= iStack_123c;
                      local_12b8 = local_12b8 + 1) {
                    local_508 = local_11e8;
                    local_510 = local_12b8;
                    local_514 = local_12b4;
                    if (0 < *(int *)(*local_11e8 +
                                    ((long)(local_1254 - (int)local_11e8[4]) +
                                     (long)(local_12b8 - *(int *)((long)local_11e8 + 0x24)) *
                                     local_11e8[1] +
                                    (long)(local_12b4 - (int)local_11e8[5]) * local_11e8[2]) * 4)) {
                      local_12c0 = 0.0;
                      for (local_12c4 = 1; local_12c4 < local_126c; local_12c4 = local_12c4 + 1) {
                        local_1118 = local_11e0;
                        local_111c = local_1254 + local_12c4 * local_1258;
                        local_1120 = local_12b8;
                        local_1124 = local_12b4;
                        local_1128 = local_1210;
                        local_16c = local_12c4;
                        local_168 = local_12b0;
                        local_12c0 = *(double *)
                                      (*local_11e0 +
                                      ((long)(local_111c - (int)local_11e0[4]) +
                                       (long)(local_12b8 - *(int *)((long)local_11e0 + 0x24)) *
                                       local_11e0[1] +
                                       (long)(local_12b4 - (int)local_11e0[5]) * local_11e0[2] +
                                      (long)local_1210 * local_11e0[3]) * 8) * local_168[local_12c4]
                                     + local_12c0;
                      }
                      local_1130 = local_11e0;
                      local_1134 = local_1254;
                      local_1138 = local_12b8;
                      local_113c = local_12b4;
                      local_1140 = local_1210;
                      *(double *)
                       (*local_11e0 +
                       ((long)(local_1254 - (int)local_11e0[4]) +
                        (long)(local_12b8 - *(int *)((long)local_11e0 + 0x24)) * local_11e0[1] +
                        (long)(local_12b4 - (int)local_11e0[5]) * local_11e0[2] +
                       (long)local_1210 * local_11e0[3]) * 8) = local_12c0;
                      if (local_120c != 0) {
                        local_1160 = local_11f8;
                        local_1164 = local_1254;
                        local_1168 = local_12b8;
                        local_116c = local_12b4;
                        local_1170 = local_1210;
                        local_158 = local_12b0;
                        local_15c = 0;
                        local_1148 = local_11e0;
                        local_114c = local_1254;
                        local_1150 = local_12b8;
                        local_1154 = local_12b4;
                        local_1158 = local_1210;
                        lVar12 = (long)(local_1254 - (int)local_11e0[4]) +
                                 (long)(local_12b8 - *(int *)((long)local_11e0 + 0x24)) *
                                 local_11e0[1] +
                                 (long)(local_12b4 - (int)local_11e0[5]) * local_11e0[2] +
                                 (long)local_1210 * local_11e0[3];
                        *(double *)(*local_11e0 + lVar12 * 8) =
                             *(double *)
                              (*local_11f8 +
                              ((long)(local_1254 - (int)local_11f8[4]) +
                               (long)(local_12b8 - *(int *)((long)local_11f8 + 0x24)) *
                               local_11f8[1] +
                               (long)(local_12b4 - (int)local_11f8[5]) * local_11f8[2] +
                              (long)local_1210 * local_11f8[3]) * 8) * local_12b0[0] +
                             *(double *)(*local_11e0 + lVar12 * 8);
                      }
                    }
                  }
                }
              }
              else if (iVar7 == 0x66) {
                for (local_125c = local_1218; local_125c <= local_1238; local_125c = local_125c + 1)
                {
                  for (local_1260 = iStack_121c; local_1260 <= iStack_123c;
                      local_1260 = local_1260 + 1) {
                    local_538 = local_11e8;
                    local_540 = local_1260;
                    local_544 = local_125c;
                    if (0 < *(int *)(*local_11e8 +
                                    ((long)(local_1254 - (int)local_11e8[4]) +
                                     (long)(local_1260 - *(int *)((long)local_11e8 + 0x24)) *
                                     local_11e8[1] +
                                    (long)(local_125c - (int)local_11e8[5]) * local_11e8[2]) * 4)) {
                      local_10bc = local_1254 + local_1258;
                      local_10b8 = local_11e0;
                      local_10c0 = local_1260;
                      local_10c4 = local_125c;
                      local_10c8 = local_1210;
                      local_10d0 = local_11e0;
                      local_10d4 = local_1254;
                      local_10d8 = local_1260;
                      local_10dc = local_125c;
                      local_10e0 = local_1210;
                      *(undefined8 *)
                       (*local_11e0 +
                       ((long)(local_1254 - (int)local_11e0[4]) +
                        (long)(local_1260 - *(int *)((long)local_11e0 + 0x24)) * local_11e0[1] +
                        (long)(local_125c - (int)local_11e0[5]) * local_11e0[2] +
                       (long)local_1210 * local_11e0[3]) * 8) =
                           *(undefined8 *)
                            (*local_11e0 +
                            ((long)(local_10bc - (int)local_11e0[4]) +
                             (long)(local_1260 - *(int *)((long)local_11e0 + 0x24)) * local_11e0[1]
                             + (long)(local_125c - (int)local_11e0[5]) * local_11e0[2] +
                            (long)local_1210 * local_11e0[3]) * 8);
                    }
                  }
                }
              }
              else if (iVar7 == 0x67) {
                for (local_1264 = local_1218; local_1264 <= local_1238; local_1264 = local_1264 + 1)
                {
                  for (local_1268 = iStack_121c; local_1268 <= iStack_123c;
                      local_1268 = local_1268 + 1) {
                    local_520 = local_11e8;
                    local_528 = local_1268;
                    local_52c = local_1264;
                    if (0 < *(int *)(*local_11e8 +
                                    ((long)(local_1254 - (int)local_11e8[4]) +
                                     (long)(local_1268 - *(int *)((long)local_11e8 + 0x24)) *
                                     local_11e8[1] +
                                    (long)(local_1264 - (int)local_11e8[5]) * local_11e8[2]) * 4)) {
                      local_10ec = local_1254 + local_1258;
                      local_10e8 = local_11e0;
                      local_10f0 = local_1268;
                      local_10f4 = local_1264;
                      local_10f8 = local_1210;
                      local_1100 = local_11e0;
                      local_1104 = local_1254;
                      local_1108 = local_1268;
                      local_110c = local_1264;
                      local_1110 = local_1210;
                      *(ulong *)(*local_11e0 +
                                ((long)(local_1254 - (int)local_11e0[4]) +
                                 (long)(local_1268 - *(int *)((long)local_11e0 + 0x24)) *
                                 local_11e0[1] +
                                 (long)(local_1264 - (int)local_11e0[5]) * local_11e0[2] +
                                (long)local_1210 * local_11e0[3]) * 8) =
                           *(ulong *)(*local_11e0 +
                                     ((long)(local_10ec - (int)local_11e0[4]) +
                                      (long)(local_1268 - *(int *)((long)local_11e0 + 0x24)) *
                                      local_11e0[1] +
                                      (long)(local_1264 - (int)local_11e0[5]) * local_11e0[2] +
                                     (long)local_1210 * local_11e0[3]) * 8) ^ 0x8000000000000000;
                    }
                  }
                }
              }
              local_1440 = 1;
              local_1448 = &stack0xffffffffffffe744;
              local_1458 = local_1828;
              local_1460 = local_1910;
              local_1470 = local_19a8;
              local_1474 = local_1690;
              local_1480 = local_16a0;
              local_1484 = local_168c;
              local_1488 = local_19f0;
              local_12d4 = 0;
              local_12e4 = 1;
              iStack_1494 = local_18b8;
              local_12f4 = 2;
              local_1490 = iStack_18b4;
              local_1300 = &iStack_18b0;
              local_1304 = 0;
              local_1310 = &iStack_18b0;
              local_1314 = 1;
              iStack_14b4 = local_18ac;
              local_1320 = &iStack_18b0;
              local_1324 = 2;
              local_14b0 = iStack_18a8;
              local_14d0 = -1;
              local_14cc = in_stack_ffffffffffffe744;
              local_1468 = vVar2;
              local_144c = iVar6;
              local_143c[0].bctype = iVar3;
              local_1428 = local_1448;
              local_1400 = local_1448;
              local_12f0 = local_1448;
              local_12e0 = local_1448;
              local_12d0 = local_1448;
              iVar7 = BoundCond::operator_cast_to_int(local_143c);
              if (iVar7 == 0x65) {
                local_14e8 = local_144c + 1;
                local_3f8 = &local_14e8;
                local_400 = &local_1474;
                piVar11 = std::min<int>(local_3f8,local_400);
                local_14e4 = *piVar11;
                local_1528[4] = -local_1468 * local_1480;
                local_1528[5] = 0.5;
                local_1528[6] = 1.5;
                local_1528[7] = 2.5;
                memset(local_1528,0,0x20);
                local_280 = local_1528 + 4;
                local_fc = 0;
                local_290 = local_1528;
                local_10c = 0;
                local_278 = 0xbfe0000000000000;
                local_284 = local_14e4;
                for (local_294 = 0; local_294 < local_14e4; local_294 = local_294 + 1) {
                  local_2a0 = 1.0;
                  local_2a8 = 1.0;
                  for (local_2ac = 0; local_2ac < local_14e4; local_2ac = local_2ac + 1) {
                    if (local_2ac != local_294) {
                      local_2a0 = (-0.5 - local_280[local_2ac]) * local_2a0;
                      local_2a8 = (local_280[local_294] - local_280[local_2ac]) * local_2a8;
                    }
                  }
                  local_290[local_294] = local_2a0 / local_2a8;
                }
                for (local_152c = local_1490; local_108 = local_290, local_f8 = local_280,
                    local_152c <= local_14b0; local_152c = local_152c + 1) {
                  for (local_1530 = iStack_1494; local_1530 <= iStack_14b4;
                      local_1530 = local_1530 + 1) {
                    local_4c0 = local_1460;
                    local_4c8 = local_1530;
                    local_4cc = local_152c;
                    if (0 < *(int *)(*local_1460 +
                                    ((long)(local_14cc - (int)local_1460[4]) +
                                     (long)(local_1530 - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                    (long)(local_152c - (int)local_1460[5]) * local_1460[2]) * 4)) {
                      local_1538 = 0.0;
                      for (local_153c = 1; local_153c < local_14e4; local_153c = local_153c + 1) {
                        local_1390 = local_1458;
                        local_1394 = local_14cc + local_153c * local_14d0;
                        local_1398 = local_1530;
                        local_139c = local_152c;
                        local_13a0 = local_1488;
                        local_12c = local_153c;
                        local_128 = local_1528;
                        local_1538 = *(double *)
                                      (*local_1458 +
                                      ((long)(local_1394 - (int)local_1458[4]) +
                                       (long)(local_1530 - *(int *)((long)local_1458 + 0x24)) *
                                       local_1458[1] +
                                       (long)(local_152c - (int)local_1458[5]) * local_1458[2] +
                                      (long)local_1488 * local_1458[3]) * 8) * local_128[local_153c]
                                     + local_1538;
                      }
                      local_13a8 = local_1458;
                      local_13ac = local_14cc;
                      local_13b0 = local_1530;
                      local_13b4 = local_152c;
                      local_13b8 = local_1488;
                      *(double *)
                       (*local_1458 +
                       ((long)(local_14cc - (int)local_1458[4]) +
                        (long)(local_1530 - *(int *)((long)local_1458 + 0x24)) * local_1458[1] +
                        (long)(local_152c - (int)local_1458[5]) * local_1458[2] +
                       (long)local_1488 * local_1458[3]) * 8) = local_1538;
                      if (local_1484 != 0) {
                        local_13d8 = local_1470;
                        local_13dc = local_14cc;
                        local_13e0 = local_1530;
                        local_13e4 = local_152c;
                        local_13e8 = local_1488;
                        local_118 = local_1528;
                        local_11c = 0;
                        local_13c0 = local_1458;
                        local_13c4 = local_14cc;
                        local_13c8 = local_1530;
                        local_13cc = local_152c;
                        local_13d0 = local_1488;
                        lVar12 = (long)(local_14cc - (int)local_1458[4]) +
                                 (long)(local_1530 - *(int *)((long)local_1458 + 0x24)) *
                                 local_1458[1] +
                                 (long)(local_152c - (int)local_1458[5]) * local_1458[2] +
                                 (long)local_1488 * local_1458[3];
                        *(double *)(*local_1458 + lVar12 * 8) =
                             *(double *)
                              (*local_1470 +
                              ((long)(local_14cc - (int)local_1470[4]) +
                               (long)(local_1530 - *(int *)((long)local_1470 + 0x24)) *
                               local_1470[1] +
                               (long)(local_152c - (int)local_1470[5]) * local_1470[2] +
                              (long)local_1488 * local_1470[3]) * 8) * local_1528[0] +
                             *(double *)(*local_1458 + lVar12 * 8);
                      }
                    }
                  }
                }
              }
              else if (iVar7 == 0x66) {
                for (local_14d4 = local_1490; local_14d4 <= local_14b0; local_14d4 = local_14d4 + 1)
                {
                  for (local_14d8 = iStack_1494; local_14d8 <= iStack_14b4;
                      local_14d8 = local_14d8 + 1) {
                    local_4f0 = local_1460;
                    local_4f8 = local_14d8;
                    local_4fc = local_14d4;
                    if (0 < *(int *)(*local_1460 +
                                    ((long)(local_14cc - (int)local_1460[4]) +
                                     (long)(local_14d8 - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                    (long)(local_14d4 - (int)local_1460[5]) * local_1460[2]) * 4)) {
                      local_1334 = local_14cc + local_14d0;
                      local_1330 = local_1458;
                      local_1338 = local_14d8;
                      local_133c = local_14d4;
                      local_1340 = local_1488;
                      local_1348 = local_1458;
                      local_134c = local_14cc;
                      local_1350 = local_14d8;
                      local_1354 = local_14d4;
                      local_1358 = local_1488;
                      *(undefined8 *)
                       (*local_1458 +
                       ((long)(local_14cc - (int)local_1458[4]) +
                        (long)(local_14d8 - *(int *)((long)local_1458 + 0x24)) * local_1458[1] +
                        (long)(local_14d4 - (int)local_1458[5]) * local_1458[2] +
                       (long)local_1488 * local_1458[3]) * 8) =
                           *(undefined8 *)
                            (*local_1458 +
                            ((long)(local_1334 - (int)local_1458[4]) +
                             (long)(local_14d8 - *(int *)((long)local_1458 + 0x24)) * local_1458[1]
                             + (long)(local_14d4 - (int)local_1458[5]) * local_1458[2] +
                            (long)local_1488 * local_1458[3]) * 8);
                    }
                  }
                }
              }
              else if (iVar7 == 0x67) {
                for (local_14dc = local_1490; local_14dc <= local_14b0; local_14dc = local_14dc + 1)
                {
                  for (local_14e0 = iStack_1494; local_14e0 <= iStack_14b4;
                      local_14e0 = local_14e0 + 1) {
                    local_4d8 = local_1460;
                    local_4e0 = local_14e0;
                    local_4e4 = local_14dc;
                    if (0 < *(int *)(*local_1460 +
                                    ((long)(local_14cc - (int)local_1460[4]) +
                                     (long)(local_14e0 - *(int *)((long)local_1460 + 0x24)) *
                                     local_1460[1] +
                                    (long)(local_14dc - (int)local_1460[5]) * local_1460[2]) * 4)) {
                      local_1364 = local_14cc + local_14d0;
                      local_1360 = local_1458;
                      local_1368 = local_14e0;
                      local_136c = local_14dc;
                      local_1370 = local_1488;
                      local_1378 = local_1458;
                      local_137c = local_14cc;
                      local_1380 = local_14e0;
                      local_1384 = local_14dc;
                      local_1388 = local_1488;
                      *(ulong *)(*local_1458 +
                                ((long)(local_14cc - (int)local_1458[4]) +
                                 (long)(local_14e0 - *(int *)((long)local_1458 + 0x24)) *
                                 local_1458[1] +
                                 (long)(local_14dc - (int)local_1458[5]) * local_1458[2] +
                                (long)local_1488 * local_1458[3]) * 8) =
                           *(ulong *)(*local_1458 +
                                     ((long)(local_1364 - (int)local_1458[4]) +
                                      (long)(local_14e0 - *(int *)((long)local_1458 + 0x24)) *
                                      local_1458[1] +
                                      (long)(local_14dc - (int)local_1458[5]) * local_1458[2] +
                                     (long)local_1488 * local_1458[3]) * 8) ^ 0x8000000000000000;
                    }
                  }
                }
              }
            }
            else if (local_187c == 1) {
              local_cd8 = 0;
              local_ce0 = &local_18a0;
              local_cf0 = local_1828;
              local_d08 = local_1958;
              local_d0c = local_1690;
              local_d18 = local_16a8;
              local_d1c = local_168c;
              local_d20 = local_19f0;
              local_b6c = 0;
              local_b7c = 1;
              local_d64 = local_18a0.smallend.vect[1];
              local_d30 = local_18a0.smallend.vect[0];
              local_b8c = 2;
              local_d28 = local_18a0.smallend.vect[2];
              local_b98 = &local_18a0.bigend;
              local_b9c = 0;
              local_ba8 = &local_18a0.bigend;
              local_bac = 1;
              local_d50 = local_18a0.bigend.vect[0];
              local_bb8 = &local_18a0.bigend;
              local_bbc = 2;
              local_d48 = local_18a0.bigend.vect[2];
              local_d68 = 1;
              local_d00 = vVar1;
              local_cf8 = plVar15;
              local_ce4 = iVar6;
              local_cd4[0].bctype = iVar7;
              local_cc0 = local_ce0;
              local_c98 = local_ce0;
              local_b88 = local_ce0;
              local_b78 = local_ce0;
              local_b68 = local_ce0;
              iVar7 = BoundCond::operator_cast_to_int(local_cd4);
              if (iVar7 == 0x65) {
                local_d80 = local_ce4 + 1;
                local_428 = &local_d80;
                local_430 = &local_d0c;
                piVar11 = std::min<int>(local_428,local_430);
                local_d7c = *piVar11;
                local_dc0[4] = -local_d00 * local_d18;
                local_dc0[5] = 0.5;
                local_dc0[6] = 1.5;
                local_dc0[7] = 2.5;
                memset(local_dc0,0,0x20);
                local_340 = local_dc0 + 4;
                local_1bc = 0;
                local_350 = local_dc0;
                local_1cc = 0;
                local_338 = 0xbfe0000000000000;
                local_344 = local_d7c;
                for (local_354 = 0; local_354 < local_d7c; local_354 = local_354 + 1) {
                  local_360 = 1.0;
                  local_368 = 1.0;
                  for (local_36c = 0; local_36c < local_d7c; local_36c = local_36c + 1) {
                    if (local_36c != local_354) {
                      local_360 = (-0.5 - local_340[local_36c]) * local_360;
                      local_368 = (local_340[local_354] - local_340[local_36c]) * local_368;
                    }
                  }
                  local_350[local_354] = local_360 / local_368;
                }
                for (local_dc4 = local_d28; local_1c8 = local_350, local_1b8 = local_340,
                    local_dc4 <= local_d48; local_dc4 = local_dc4 + 1) {
                  for (local_dc8 = local_d30; local_dc8 <= local_d50; local_dc8 = local_dc8 + 1) {
                    local_598 = local_cf8;
                    local_59c = local_dc8;
                    local_5a4 = local_dc4;
                    if (0 < *(int *)(*local_cf8 +
                                    ((long)(local_dc8 - (int)local_cf8[4]) +
                                     (long)(local_d64 - *(int *)((long)local_cf8 + 0x24)) *
                                     local_cf8[1] +
                                    (long)(local_dc4 - (int)local_cf8[5]) * local_cf8[2]) * 4)) {
                      local_dd0 = 0.0;
                      for (local_dd4 = 1; local_dd4 < local_d7c; local_dd4 = local_dd4 + 1) {
                        local_c28 = local_cf0;
                        local_c2c = local_dc8;
                        local_c30 = local_d64 + local_dd4 * local_d68;
                        local_c34 = local_dc4;
                        local_c38 = local_d20;
                        local_1ec = local_dd4;
                        local_1e8 = local_dc0;
                        local_dd0 = *(double *)
                                     (*local_cf0 +
                                     ((long)(local_dc8 - (int)local_cf0[4]) +
                                      (long)(local_c30 - *(int *)((long)local_cf0 + 0x24)) *
                                      local_cf0[1] +
                                      (long)(local_dc4 - (int)local_cf0[5]) * local_cf0[2] +
                                     (long)local_d20 * local_cf0[3]) * 8) * local_1e8[local_dd4] +
                                    local_dd0;
                      }
                      local_c40 = local_cf0;
                      local_c44 = local_dc8;
                      local_c48 = local_d64;
                      local_c4c = local_dc4;
                      local_c50 = local_d20;
                      *(double *)
                       (*local_cf0 +
                       ((long)(local_dc8 - (int)local_cf0[4]) +
                        (long)(local_d64 - *(int *)((long)local_cf0 + 0x24)) * local_cf0[1] +
                        (long)(local_dc4 - (int)local_cf0[5]) * local_cf0[2] +
                       (long)local_d20 * local_cf0[3]) * 8) = local_dd0;
                      if (local_d1c != 0) {
                        local_c70 = local_d08;
                        local_c74 = local_dc8;
                        local_c78 = local_d64;
                        local_c7c = local_dc4;
                        local_c80 = local_d20;
                        local_1d8 = local_dc0;
                        local_1dc = 0;
                        local_c58 = local_cf0;
                        local_c5c = local_dc8;
                        local_c60 = local_d64;
                        local_c64 = local_dc4;
                        local_c68 = local_d20;
                        lVar12 = (long)(local_dc8 - (int)local_cf0[4]) +
                                 (long)(local_d64 - *(int *)((long)local_cf0 + 0x24)) * local_cf0[1]
                                 + (long)(local_dc4 - (int)local_cf0[5]) * local_cf0[2] +
                                 (long)local_d20 * local_cf0[3];
                        *(double *)(*local_cf0 + lVar12 * 8) =
                             *(double *)
                              (*local_d08 +
                              ((long)(local_dc8 - (int)local_d08[4]) +
                               (long)(local_d64 - *(int *)((long)local_d08 + 0x24)) * local_d08[1] +
                               (long)(local_dc4 - (int)local_d08[5]) * local_d08[2] +
                              (long)local_d20 * local_d08[3]) * 8) * local_dc0[0] +
                             *(double *)(*local_cf0 + lVar12 * 8);
                      }
                    }
                  }
                }
              }
              else if (iVar7 == 0x66) {
                for (local_d6c = local_d28; local_d6c <= local_d48; local_d6c = local_d6c + 1) {
                  for (local_d70 = local_d30; local_d70 <= local_d50; local_d70 = local_d70 + 1) {
                    local_5c8 = local_cf8;
                    local_5cc = local_d70;
                    local_5d4 = local_d6c;
                    if (0 < *(int *)(*local_cf8 +
                                    ((long)(local_d70 - (int)local_cf8[4]) +
                                     (long)(local_d64 - *(int *)((long)local_cf8 + 0x24)) *
                                     local_cf8[1] +
                                    (long)(local_d6c - (int)local_cf8[5]) * local_cf8[2]) * 4)) {
                      local_bd0 = local_d64 + local_d68;
                      local_bc8 = local_cf0;
                      local_bcc = local_d70;
                      local_bd4 = local_d6c;
                      local_bd8 = local_d20;
                      local_be0 = local_cf0;
                      local_be4 = local_d70;
                      local_be8 = local_d64;
                      local_bec = local_d6c;
                      local_bf0 = local_d20;
                      *(undefined8 *)
                       (*local_cf0 +
                       ((long)(local_d70 - (int)local_cf0[4]) +
                        (long)(local_d64 - *(int *)((long)local_cf0 + 0x24)) * local_cf0[1] +
                        (long)(local_d6c - (int)local_cf0[5]) * local_cf0[2] +
                       (long)local_d20 * local_cf0[3]) * 8) =
                           *(undefined8 *)
                            (*local_cf0 +
                            ((long)(local_d70 - (int)local_cf0[4]) +
                             (long)(local_bd0 - *(int *)((long)local_cf0 + 0x24)) * local_cf0[1] +
                             (long)(local_d6c - (int)local_cf0[5]) * local_cf0[2] +
                            (long)local_d20 * local_cf0[3]) * 8);
                    }
                  }
                }
              }
              else if (iVar7 == 0x67) {
                for (local_d74 = local_d28; local_d74 <= local_d48; local_d74 = local_d74 + 1) {
                  for (local_d78 = local_d30; local_d78 <= local_d50; local_d78 = local_d78 + 1) {
                    local_5b0 = local_cf8;
                    local_5b4 = local_d78;
                    local_5bc = local_d74;
                    if (0 < *(int *)(*local_cf8 +
                                    ((long)(local_d78 - (int)local_cf8[4]) +
                                     (long)(local_d64 - *(int *)((long)local_cf8 + 0x24)) *
                                     local_cf8[1] +
                                    (long)(local_d74 - (int)local_cf8[5]) * local_cf8[2]) * 4)) {
                      local_c00 = local_d64 + local_d68;
                      local_bf8 = local_cf0;
                      local_bfc = local_d78;
                      local_c04 = local_d74;
                      local_c08 = local_d20;
                      local_c10 = local_cf0;
                      local_c14 = local_d78;
                      local_c18 = local_d64;
                      local_c1c = local_d74;
                      local_c20 = local_d20;
                      *(ulong *)(*local_cf0 +
                                ((long)(local_d78 - (int)local_cf0[4]) +
                                 (long)(local_d64 - *(int *)((long)local_cf0 + 0x24)) * local_cf0[1]
                                 + (long)(local_d74 - (int)local_cf0[5]) * local_cf0[2] +
                                (long)local_d20 * local_cf0[3]) * 8) =
                           *(ulong *)(*local_cf0 +
                                     ((long)(local_d78 - (int)local_cf0[4]) +
                                      (long)(local_c00 - *(int *)((long)local_cf0 + 0x24)) *
                                      local_cf0[1] +
                                      (long)(local_d74 - (int)local_cf0[5]) * local_cf0[2] +
                                     (long)local_d20 * local_cf0[3]) * 8) ^ 0x8000000000000000;
                    }
                  }
                }
              }
              local_f50 = 1;
              local_f58 = &stack0xffffffffffffe744;
              local_f68 = local_1828;
              local_f70 = local_1910;
              local_f80 = local_19a8;
              local_f84 = local_1690;
              local_f90 = local_16a8;
              local_f94 = local_168c;
              local_f98 = local_19f0;
              local_de4 = 0;
              local_df4 = 1;
              local_fdc = local_18b8;
              local_e04 = 2;
              local_fa0 = iStack_18b4;
              local_e10 = &iStack_18b0;
              local_e14 = 0;
              local_e20 = &iStack_18b0;
              local_e24 = 1;
              local_fc8 = iStack_18b0;
              local_e30 = &iStack_18b0;
              local_e34 = 2;
              local_fc0 = iStack_18a8;
              local_fe0 = -1;
              local_f78 = vVar2;
              local_f5c = iVar6;
              local_f4c[0].bctype = iVar3;
              local_f38 = local_f58;
              local_f10 = local_f58;
              local_e00 = local_f58;
              local_df0 = local_f58;
              local_de0 = local_f58;
              local_fa8 = in_stack_ffffffffffffe744;
              iVar7 = BoundCond::operator_cast_to_int(local_f4c);
              if (iVar7 == 0x65) {
                local_ff8 = local_f5c + 1;
                local_418 = &local_ff8;
                local_420 = &local_f84;
                piVar11 = std::min<int>(local_418,local_420);
                local_ff4 = *piVar11;
                local_1038[4] = -local_f78 * local_f90;
                local_1038[5] = 0.5;
                local_1038[6] = 1.5;
                local_1038[7] = 2.5;
                memset(local_1038,0,0x20);
                local_300 = local_1038 + 4;
                local_17c = 0;
                local_310 = local_1038;
                local_18c = 0;
                local_2f8 = 0xbfe0000000000000;
                local_304 = local_ff4;
                for (local_314 = 0; local_314 < local_ff4; local_314 = local_314 + 1) {
                  local_320 = 1.0;
                  local_328 = 1.0;
                  for (local_32c = 0; local_32c < local_ff4; local_32c = local_32c + 1) {
                    if (local_32c != local_314) {
                      local_320 = (-0.5 - local_300[local_32c]) * local_320;
                      local_328 = (local_300[local_314] - local_300[local_32c]) * local_328;
                    }
                  }
                  local_310[local_314] = local_320 / local_328;
                }
                for (local_103c = local_fa0; local_188 = local_310, local_178 = local_300,
                    local_103c <= local_fc0; local_103c = local_103c + 1) {
                  for (local_1040 = local_fa8; local_1040 <= local_fc8; local_1040 = local_1040 + 1)
                  {
                    local_550 = local_f70;
                    local_554 = local_1040;
                    local_55c = local_103c;
                    if (0 < *(int *)(*local_f70 +
                                    ((long)(local_1040 - (int)local_f70[4]) +
                                     (long)(local_fdc - *(int *)((long)local_f70 + 0x24)) *
                                     local_f70[1] +
                                    (long)(local_103c - (int)local_f70[5]) * local_f70[2]) * 4)) {
                      local_1048 = 0.0;
                      for (local_104c = 1; local_104c < local_ff4; local_104c = local_104c + 1) {
                        local_ea0 = local_f68;
                        local_ea4 = local_1040;
                        local_ea8 = local_fdc + local_104c * local_fe0;
                        local_eac = local_103c;
                        local_eb0 = local_f98;
                        local_1ac = local_104c;
                        local_1a8 = local_1038;
                        local_1048 = *(double *)
                                      (*local_f68 +
                                      ((long)(local_1040 - (int)local_f68[4]) +
                                       (long)(local_ea8 - *(int *)((long)local_f68 + 0x24)) *
                                       local_f68[1] +
                                       (long)(local_103c - (int)local_f68[5]) * local_f68[2] +
                                      (long)local_f98 * local_f68[3]) * 8) * local_1a8[local_104c] +
                                     local_1048;
                      }
                      local_eb8 = local_f68;
                      local_ebc = local_1040;
                      local_ec0 = local_fdc;
                      local_ec4 = local_103c;
                      local_ec8 = local_f98;
                      *(double *)
                       (*local_f68 +
                       ((long)(local_1040 - (int)local_f68[4]) +
                        (long)(local_fdc - *(int *)((long)local_f68 + 0x24)) * local_f68[1] +
                        (long)(local_103c - (int)local_f68[5]) * local_f68[2] +
                       (long)local_f98 * local_f68[3]) * 8) = local_1048;
                      if (local_f94 != 0) {
                        local_ee8 = local_f80;
                        local_eec = local_1040;
                        local_ef0 = local_fdc;
                        local_ef4 = local_103c;
                        local_ef8 = local_f98;
                        local_198 = local_1038;
                        local_19c = 0;
                        local_ed0 = local_f68;
                        local_ed4 = local_1040;
                        local_ed8 = local_fdc;
                        local_edc = local_103c;
                        local_ee0 = local_f98;
                        lVar12 = (long)(local_1040 - (int)local_f68[4]) +
                                 (long)(local_fdc - *(int *)((long)local_f68 + 0x24)) * local_f68[1]
                                 + (long)(local_103c - (int)local_f68[5]) * local_f68[2] +
                                 (long)local_f98 * local_f68[3];
                        *(double *)(*local_f68 + lVar12 * 8) =
                             *(double *)
                              (*local_f80 +
                              ((long)(local_1040 - (int)local_f80[4]) +
                               (long)(local_fdc - *(int *)((long)local_f80 + 0x24)) * local_f80[1] +
                               (long)(local_103c - (int)local_f80[5]) * local_f80[2] +
                              (long)local_f98 * local_f80[3]) * 8) * local_1038[0] +
                             *(double *)(*local_f68 + lVar12 * 8);
                      }
                    }
                  }
                }
              }
              else if (iVar7 == 0x66) {
                for (local_fe4 = local_fa0; local_fe4 <= local_fc0; local_fe4 = local_fe4 + 1) {
                  for (local_fe8 = local_fa8; local_fe8 <= local_fc8; local_fe8 = local_fe8 + 1) {
                    local_580 = local_f70;
                    local_584 = local_fe8;
                    local_58c = local_fe4;
                    if (0 < *(int *)(*local_f70 +
                                    ((long)(local_fe8 - (int)local_f70[4]) +
                                     (long)(local_fdc - *(int *)((long)local_f70 + 0x24)) *
                                     local_f70[1] +
                                    (long)(local_fe4 - (int)local_f70[5]) * local_f70[2]) * 4)) {
                      local_e48 = local_fdc + local_fe0;
                      local_e40 = local_f68;
                      local_e44 = local_fe8;
                      local_e4c = local_fe4;
                      local_e50 = local_f98;
                      local_e58 = local_f68;
                      local_e5c = local_fe8;
                      local_e60 = local_fdc;
                      local_e64 = local_fe4;
                      local_e68 = local_f98;
                      *(undefined8 *)
                       (*local_f68 +
                       ((long)(local_fe8 - (int)local_f68[4]) +
                        (long)(local_fdc - *(int *)((long)local_f68 + 0x24)) * local_f68[1] +
                        (long)(local_fe4 - (int)local_f68[5]) * local_f68[2] +
                       (long)local_f98 * local_f68[3]) * 8) =
                           *(undefined8 *)
                            (*local_f68 +
                            ((long)(local_fe8 - (int)local_f68[4]) +
                             (long)(local_e48 - *(int *)((long)local_f68 + 0x24)) * local_f68[1] +
                             (long)(local_fe4 - (int)local_f68[5]) * local_f68[2] +
                            (long)local_f98 * local_f68[3]) * 8);
                    }
                  }
                }
              }
              else if (iVar7 == 0x67) {
                for (local_fec = local_fa0; local_fec <= local_fc0; local_fec = local_fec + 1) {
                  for (local_ff0 = local_fa8; local_ff0 <= local_fc8; local_ff0 = local_ff0 + 1) {
                    local_568 = local_f70;
                    local_56c = local_ff0;
                    local_574 = local_fec;
                    if (0 < *(int *)(*local_f70 +
                                    ((long)(local_ff0 - (int)local_f70[4]) +
                                     (long)(local_fdc - *(int *)((long)local_f70 + 0x24)) *
                                     local_f70[1] +
                                    (long)(local_fec - (int)local_f70[5]) * local_f70[2]) * 4)) {
                      local_e78 = local_fdc + local_fe0;
                      local_e70 = local_f68;
                      local_e74 = local_ff0;
                      local_e7c = local_fec;
                      local_e80 = local_f98;
                      local_e88 = local_f68;
                      local_e8c = local_ff0;
                      local_e90 = local_fdc;
                      local_e94 = local_fec;
                      local_e98 = local_f98;
                      *(ulong *)(*local_f68 +
                                ((long)(local_ff0 - (int)local_f68[4]) +
                                 (long)(local_fdc - *(int *)((long)local_f68 + 0x24)) * local_f68[1]
                                 + (long)(local_fec - (int)local_f68[5]) * local_f68[2] +
                                (long)local_f98 * local_f68[3]) * 8) =
                           *(ulong *)(*local_f68 +
                                     ((long)(local_ff0 - (int)local_f68[4]) +
                                      (long)(local_e78 - *(int *)((long)local_f68 + 0x24)) *
                                      local_f68[1] +
                                      (long)(local_fec - (int)local_f68[5]) * local_f68[2] +
                                     (long)local_f98 * local_f68[3]) * 8) ^ 0x8000000000000000;
                    }
                  }
                }
              }
            }
            else {
              local_7e8 = 0;
              local_7f0 = &local_18a0;
              local_800 = local_1828;
              local_818 = local_1958;
              local_81c = local_1690;
              local_828 = local_16b0;
              local_82c = local_168c;
              local_830 = local_19f0;
              local_67c = 0;
              local_68c = 1;
              local_840 = local_18a0.smallend.vect[0];
              iStack_83c = local_18a0.smallend.vect[1];
              local_69c = 2;
              local_874 = local_18a0.smallend.vect[2];
              local_6a8 = &local_18a0.bigend;
              local_6ac = 0;
              local_6b8 = &local_18a0.bigend;
              local_6bc = 1;
              local_860 = local_18a0.bigend.vect[0];
              iStack_85c = local_18a0.bigend.vect[1];
              local_6c8 = &local_18a0.bigend;
              local_6cc = 2;
              local_878 = 1;
              local_810 = vVar1;
              local_808 = plVar15;
              local_7f4 = iVar6;
              local_7e4[0].bctype = iVar7;
              local_7d0 = local_7f0;
              local_7a8 = local_7f0;
              local_698 = local_7f0;
              local_688 = local_7f0;
              local_678 = local_7f0;
              in_stack_ffffffffffffe52c = BoundCond::operator_cast_to_int(local_7e4);
              if (in_stack_ffffffffffffe52c == 0x65) {
                local_890 = local_7f4 + 1;
                local_448 = &local_890;
                local_450 = &local_81c;
                in_stack_ffffffffffffe520 = (MFIter *)std::min<int>(local_448,local_450);
                local_88c = *(int *)&(in_stack_ffffffffffffe520->m_fa)._M_t.
                                     super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                     .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                     _M_head_impl;
                local_8d0[4] = -local_810 * local_828;
                local_8d0[5] = 0.5;
                local_8d0[6] = 1.5;
                local_8d0[7] = 2.5;
                memset(local_8d0,0,0x20);
                local_3c0 = local_8d0 + 4;
                local_23c = 0;
                local_3d0 = local_8d0;
                local_24c = 0;
                local_3b8 = 0xbfe0000000000000;
                local_3c4 = local_88c;
                for (local_3d4 = 0; local_3d4 < local_88c; local_3d4 = local_3d4 + 1) {
                  local_3e0 = 1.0;
                  local_3e8 = 1.0;
                  for (local_3ec = 0; local_3ec < local_88c; local_3ec = local_3ec + 1) {
                    if (local_3ec != local_3d4) {
                      local_3e0 = (-0.5 - local_3c0[local_3ec]) * local_3e0;
                      local_3e8 = (local_3c0[local_3d4] - local_3c0[local_3ec]) * local_3e8;
                    }
                  }
                  local_3d0[local_3d4] = local_3e0 / local_3e8;
                }
                for (local_8d4 = iStack_83c; local_248 = local_3d0, local_238 = local_3c0,
                    local_8d4 <= iStack_85c; local_8d4 = local_8d4 + 1) {
                  for (local_8d8 = local_840; local_8d8 <= local_860; local_8d8 = local_8d8 + 1) {
                    local_628 = local_808;
                    local_62c = local_8d8;
                    local_630 = local_8d4;
                    if (0 < *(int *)(*local_808 +
                                    ((long)(local_8d8 - (int)local_808[4]) +
                                     (long)(local_8d4 - *(int *)((long)local_808 + 0x24)) *
                                     local_808[1] +
                                    (long)(local_874 - (int)local_808[5]) * local_808[2]) * 4)) {
                      local_8e0 = 0.0;
                      for (local_8e4 = 1; local_8e4 < local_88c; local_8e4 = local_8e4 + 1) {
                        local_738 = local_800;
                        local_73c = local_8d8;
                        local_740 = local_8d4;
                        local_744 = local_874 + local_8e4 * local_878;
                        local_748 = local_830;
                        local_26c = local_8e4;
                        local_268 = local_8d0;
                        local_8e0 = *(double *)
                                     (*local_800 +
                                     ((long)(local_8d8 - (int)local_800[4]) +
                                      (long)(local_8d4 - *(int *)((long)local_800 + 0x24)) *
                                      local_800[1] +
                                      (long)(local_744 - (int)local_800[5]) * local_800[2] +
                                     (long)local_830 * local_800[3]) * 8) * local_268[local_8e4] +
                                    local_8e0;
                      }
                      local_750 = local_800;
                      local_754 = local_8d8;
                      local_758 = local_8d4;
                      local_75c = local_874;
                      local_760 = local_830;
                      *(double *)
                       (*local_800 +
                       ((long)(local_8d8 - (int)local_800[4]) +
                        (long)(local_8d4 - *(int *)((long)local_800 + 0x24)) * local_800[1] +
                        (long)(local_874 - (int)local_800[5]) * local_800[2] +
                       (long)local_830 * local_800[3]) * 8) = local_8e0;
                      if (local_82c != 0) {
                        local_780 = local_818;
                        local_784 = local_8d8;
                        local_788 = local_8d4;
                        local_78c = local_874;
                        local_790 = local_830;
                        local_258 = local_8d0;
                        local_25c = 0;
                        local_768 = local_800;
                        local_76c = local_8d8;
                        local_770 = local_8d4;
                        local_774 = local_874;
                        local_778 = local_830;
                        lVar12 = (long)(local_8d8 - (int)local_800[4]) +
                                 (long)(local_8d4 - *(int *)((long)local_800 + 0x24)) * local_800[1]
                                 + (long)(local_874 - (int)local_800[5]) * local_800[2] +
                                 (long)local_830 * local_800[3];
                        *(double *)(*local_800 + lVar12 * 8) =
                             *(double *)
                              (*local_818 +
                              ((long)(local_8d8 - (int)local_818[4]) +
                               (long)(local_8d4 - *(int *)((long)local_818 + 0x24)) * local_818[1] +
                               (long)(local_874 - (int)local_818[5]) * local_818[2] +
                              (long)local_830 * local_818[3]) * 8) * local_8d0[0] +
                             *(double *)(*local_800 + lVar12 * 8);
                      }
                    }
                  }
                }
              }
              else if (in_stack_ffffffffffffe52c == 0x66) {
                for (local_87c = iStack_83c; local_87c <= iStack_85c; local_87c = local_87c + 1) {
                  for (local_880 = local_840; local_880 <= local_860; local_880 = local_880 + 1) {
                    local_658 = local_808;
                    local_65c = local_880;
                    local_660 = local_87c;
                    if (0 < *(int *)(*local_808 +
                                    ((long)(local_880 - (int)local_808[4]) +
                                     (long)(local_87c - *(int *)((long)local_808 + 0x24)) *
                                     local_808[1] +
                                    (long)(local_874 - (int)local_808[5]) * local_808[2]) * 4)) {
                      local_6e4 = local_874 + local_878;
                      local_6d8 = local_800;
                      local_6dc = local_880;
                      local_6e0 = local_87c;
                      local_6e8 = local_830;
                      local_6f0 = local_800;
                      local_6f4 = local_880;
                      local_6f8 = local_87c;
                      local_6fc = local_874;
                      local_700 = local_830;
                      *(undefined8 *)
                       (*local_800 +
                       ((long)(local_880 - (int)local_800[4]) +
                        (long)(local_87c - *(int *)((long)local_800 + 0x24)) * local_800[1] +
                        (long)(local_874 - (int)local_800[5]) * local_800[2] +
                       (long)local_830 * local_800[3]) * 8) =
                           *(undefined8 *)
                            (*local_800 +
                            ((long)(local_880 - (int)local_800[4]) +
                             (long)(local_87c - *(int *)((long)local_800 + 0x24)) * local_800[1] +
                             (long)(local_6e4 - (int)local_800[5]) * local_800[2] +
                            (long)local_830 * local_800[3]) * 8);
                    }
                  }
                }
              }
              else if (in_stack_ffffffffffffe52c == 0x67) {
                for (local_884 = iStack_83c; local_884 <= iStack_85c; local_884 = local_884 + 1) {
                  for (local_888 = local_840; local_888 <= local_860; local_888 = local_888 + 1) {
                    local_640 = local_808;
                    local_644 = local_888;
                    local_648 = local_884;
                    if (0 < *(int *)(*local_808 +
                                    ((long)(local_888 - (int)local_808[4]) +
                                     (long)(local_884 - *(int *)((long)local_808 + 0x24)) *
                                     local_808[1] +
                                    (long)(local_874 - (int)local_808[5]) * local_808[2]) * 4)) {
                      local_714 = local_874 + local_878;
                      local_708 = local_800;
                      local_70c = local_888;
                      local_710 = local_884;
                      local_718 = local_830;
                      local_720 = local_800;
                      local_724 = local_888;
                      local_728 = local_884;
                      local_72c = local_874;
                      local_730 = local_830;
                      *(ulong *)(*local_800 +
                                ((long)(local_888 - (int)local_800[4]) +
                                 (long)(local_884 - *(int *)((long)local_800 + 0x24)) * local_800[1]
                                 + (long)(local_874 - (int)local_800[5]) * local_800[2] +
                                (long)local_830 * local_800[3]) * 8) =
                           *(ulong *)(*local_800 +
                                     ((long)(local_888 - (int)local_800[4]) +
                                      (long)(local_884 - *(int *)((long)local_800 + 0x24)) *
                                      local_800[1] +
                                      (long)(local_714 - (int)local_800[5]) * local_800[2] +
                                     (long)local_830 * local_800[3]) * 8) ^ 0x8000000000000000;
                    }
                  }
                }
              }
              local_a60 = 1;
              local_a68 = &stack0xffffffffffffe744;
              local_a78 = local_1828;
              local_a80 = local_1910;
              local_a90 = local_19a8;
              local_a94 = local_1690;
              local_aa0 = local_16b0;
              local_aa4 = local_168c;
              local_aa8 = local_19f0;
              local_8f4 = 0;
              local_904 = 1;
              iStack_ab4 = local_18b8;
              local_914 = 2;
              local_aec = iStack_18b4;
              local_920 = &iStack_18b0;
              local_924 = 0;
              local_930 = &iStack_18b0;
              local_934 = 1;
              local_ad8 = iStack_18b0;
              iStack_ad4 = local_18ac;
              local_940 = &iStack_18b0;
              local_944 = 2;
              local_af0 = -1;
              local_a88 = vVar2;
              local_a6c = iVar6;
              local_a5c[0].bctype = iVar3;
              local_a48 = local_a68;
              local_a20 = local_a68;
              local_910 = local_a68;
              local_900 = local_a68;
              local_8f0 = local_a68;
              local_ab8 = in_stack_ffffffffffffe744;
              in_stack_ffffffffffffe51c = BoundCond::operator_cast_to_int(local_a5c);
              if (in_stack_ffffffffffffe51c == 0x65) {
                local_b08 = local_a6c + 1;
                local_438 = &local_b08;
                local_440 = &local_a94;
                in_stack_ffffffffffffe510 = (BndryCondLoc *)std::min<int>(local_438,local_440);
                local_b04 = *(int *)&(((_Vector_impl *)
                                      &(in_stack_ffffffffffffe510->bcond).super_FabArrayBase.
                                       _vptr_FabArrayBase)->super__Vector_impl_data)._M_start;
                local_b48[4] = -local_a88 * local_aa0;
                local_b48[5] = 0.5;
                local_b48[6] = 1.5;
                local_b48[7] = 2.5;
                memset(local_b48,0,0x20);
                local_380 = local_b48 + 4;
                local_1fc = 0;
                local_390 = local_b48;
                local_20c = 0;
                local_378 = 0xbfe0000000000000;
                local_384 = local_b04;
                for (local_394 = 0; local_394 < local_b04; local_394 = local_394 + 1) {
                  local_3a0 = 1.0;
                  local_3a8 = 1.0;
                  for (local_3ac = 0; local_3ac < local_b04; local_3ac = local_3ac + 1) {
                    if (local_3ac != local_394) {
                      local_3a0 = (-0.5 - local_380[local_3ac]) * local_3a0;
                      local_3a8 = (local_380[local_394] - local_380[local_3ac]) * local_3a8;
                    }
                  }
                  local_390[local_394] = local_3a0 / local_3a8;
                }
                for (local_b4c = iStack_ab4; local_208 = local_390, local_1f8 = local_380,
                    local_b4c <= iStack_ad4; local_b4c = local_b4c + 1) {
                  for (local_b50 = local_ab8; local_b50 <= local_ad8; local_b50 = local_b50 + 1) {
                    local_5e0 = local_a80;
                    local_5e4 = local_b50;
                    local_5e8 = local_b4c;
                    if (0 < *(int *)(*local_a80 +
                                    ((long)(local_b50 - (int)local_a80[4]) +
                                     (long)(local_b4c - *(int *)((long)local_a80 + 0x24)) *
                                     local_a80[1] +
                                    (long)(local_aec - (int)local_a80[5]) * local_a80[2]) * 4)) {
                      local_b58 = 0.0;
                      for (local_b5c = 1; local_b5c < local_b04; local_b5c = local_b5c + 1) {
                        local_9b0 = local_a78;
                        local_9b4 = local_b50;
                        local_9b8 = local_b4c;
                        local_9bc = local_aec + local_b5c * local_af0;
                        local_9c0 = local_aa8;
                        local_22c = local_b5c;
                        local_228 = local_b48;
                        local_b58 = *(double *)
                                     (*local_a78 +
                                     ((long)(local_b50 - (int)local_a78[4]) +
                                      (long)(local_b4c - *(int *)((long)local_a78 + 0x24)) *
                                      local_a78[1] +
                                      (long)(local_9bc - (int)local_a78[5]) * local_a78[2] +
                                     (long)local_aa8 * local_a78[3]) * 8) * local_228[local_b5c] +
                                    local_b58;
                      }
                      local_9c8 = local_a78;
                      local_9cc = local_b50;
                      local_9d0 = local_b4c;
                      local_9d4 = local_aec;
                      local_9d8 = local_aa8;
                      *(double *)
                       (*local_a78 +
                       ((long)(local_b50 - (int)local_a78[4]) +
                        (long)(local_b4c - *(int *)((long)local_a78 + 0x24)) * local_a78[1] +
                        (long)(local_aec - (int)local_a78[5]) * local_a78[2] +
                       (long)local_aa8 * local_a78[3]) * 8) = local_b58;
                      if (local_aa4 != 0) {
                        local_9f8 = local_a90;
                        local_9fc = local_b50;
                        local_a00 = local_b4c;
                        local_a04 = local_aec;
                        local_a08 = local_aa8;
                        local_218 = local_b48;
                        local_21c = 0;
                        local_9e0 = local_a78;
                        local_9e4 = local_b50;
                        local_9e8 = local_b4c;
                        local_9ec = local_aec;
                        local_9f0 = local_aa8;
                        lVar12 = (long)(local_b50 - (int)local_a78[4]) +
                                 (long)(local_b4c - *(int *)((long)local_a78 + 0x24)) * local_a78[1]
                                 + (long)(local_aec - (int)local_a78[5]) * local_a78[2] +
                                 (long)local_aa8 * local_a78[3];
                        *(double *)(*local_a78 + lVar12 * 8) =
                             *(double *)
                              (*local_a90 +
                              ((long)(local_b50 - (int)local_a90[4]) +
                               (long)(local_b4c - *(int *)((long)local_a90 + 0x24)) * local_a90[1] +
                               (long)(local_aec - (int)local_a90[5]) * local_a90[2] +
                              (long)local_aa8 * local_a90[3]) * 8) * local_b48[0] +
                             *(double *)(*local_a78 + lVar12 * 8);
                      }
                    }
                  }
                }
              }
              else if (in_stack_ffffffffffffe51c == 0x66) {
                for (local_af4 = iStack_ab4; local_af4 <= iStack_ad4; local_af4 = local_af4 + 1) {
                  for (local_af8 = local_ab8; local_af8 <= local_ad8; local_af8 = local_af8 + 1) {
                    local_610 = local_a80;
                    local_614 = local_af8;
                    local_618 = local_af4;
                    if (0 < *(int *)(*local_a80 +
                                    ((long)(local_af8 - (int)local_a80[4]) +
                                     (long)(local_af4 - *(int *)((long)local_a80 + 0x24)) *
                                     local_a80[1] +
                                    (long)(local_aec - (int)local_a80[5]) * local_a80[2]) * 4)) {
                      local_95c = local_aec + local_af0;
                      local_950 = local_a78;
                      local_954 = local_af8;
                      local_958 = local_af4;
                      local_960 = local_aa8;
                      local_968 = local_a78;
                      local_96c = local_af8;
                      local_970 = local_af4;
                      local_974 = local_aec;
                      local_978 = local_aa8;
                      *(undefined8 *)
                       (*local_a78 +
                       ((long)(local_af8 - (int)local_a78[4]) +
                        (long)(local_af4 - *(int *)((long)local_a78 + 0x24)) * local_a78[1] +
                        (long)(local_aec - (int)local_a78[5]) * local_a78[2] +
                       (long)local_aa8 * local_a78[3]) * 8) =
                           *(undefined8 *)
                            (*local_a78 +
                            ((long)(local_af8 - (int)local_a78[4]) +
                             (long)(local_af4 - *(int *)((long)local_a78 + 0x24)) * local_a78[1] +
                             (long)(local_95c - (int)local_a78[5]) * local_a78[2] +
                            (long)local_aa8 * local_a78[3]) * 8);
                    }
                  }
                }
              }
              else if (in_stack_ffffffffffffe51c == 0x67) {
                for (local_afc = iStack_ab4; local_afc <= iStack_ad4; local_afc = local_afc + 1) {
                  for (local_b00 = local_ab8; local_b00 <= local_ad8; local_b00 = local_b00 + 1) {
                    local_5f8 = local_a80;
                    local_5fc = local_b00;
                    local_600 = local_afc;
                    if (0 < *(int *)(*local_a80 +
                                    ((long)(local_b00 - (int)local_a80[4]) +
                                     (long)(local_afc - *(int *)((long)local_a80 + 0x24)) *
                                     local_a80[1] +
                                    (long)(local_aec - (int)local_a80[5]) * local_a80[2]) * 4)) {
                      local_98c = local_aec + local_af0;
                      local_980 = local_a78;
                      local_984 = local_b00;
                      local_988 = local_afc;
                      local_990 = local_aa8;
                      local_998 = local_a78;
                      local_99c = local_b00;
                      local_9a0 = local_afc;
                      local_9a4 = local_aec;
                      local_9a8 = local_aa8;
                      *(ulong *)(*local_a78 +
                                ((long)(local_b00 - (int)local_a78[4]) +
                                 (long)(local_afc - *(int *)((long)local_a78 + 0x24)) * local_a78[1]
                                 + (long)(local_aec - (int)local_a78[5]) * local_a78[2] +
                                (long)local_aa8 * local_a78[3]) * 8) =
                           *(ulong *)(*local_a78 +
                                     ((long)(local_b00 - (int)local_a78[4]) +
                                      (long)(local_afc - *(int *)((long)local_a78 + 0x24)) *
                                      local_a78[1] +
                                      (long)(local_98c - (int)local_a78[5]) * local_a78[2] +
                                     (long)local_aa8 * local_a78[3]) * 8) ^ 0x8000000000000000;
                    }
                  }
                }
              }
            }
          }
        }
      }
      MFIter::operator++(&local_17f8);
    }
    MFIter::~MFIter((MFIter *)in_stack_ffffffffffffe510);
  }
  FArrayBox::~FArrayBox((FArrayBox *)0x1285f93);
  return;
}

Assistant:

void
MLCellLinOp::applyBC (int amrlev, int mglev, MultiFab& in, BCMode bc_mode, StateMode,
                      const MLMGBndry* bndry, bool skip_fillboundary) const
{
    BL_PROFILE("MLCellLinOp::applyBC()");
    // No coarsened boundary values, cannot apply inhomog at mglev>0.
    BL_ASSERT(mglev == 0 || bc_mode == BCMode::Homogeneous);
    BL_ASSERT(bndry != nullptr || bc_mode == BCMode::Homogeneous);

    const int ncomp = getNComp();
    const int cross = isCrossStencil();
    const int tensorop = isTensorOp();
    if (!skip_fillboundary) {
        in.FillBoundary(0, ncomp, m_geom[amrlev][mglev].periodicity(),cross);
    }

    int flagbc = bc_mode == BCMode::Inhomogeneous;
    const int imaxorder = maxorder;

    const Real* dxinv = m_geom[amrlev][mglev].InvCellSize();
    const Real dxi = dxinv[0];
    const Real dyi = (AMREX_SPACEDIM >= 2) ? dxinv[1] : Real(1.0);
    const Real dzi = (AMREX_SPACEDIM == 3) ? dxinv[2] : Real(1.0);

    const auto& maskvals = m_maskvals[amrlev][mglev];
    const auto& bcondloc = *m_bcondloc[amrlev][mglev];

    FArrayBox foofab(Box::TheUnitBox(),ncomp);
    const auto& foo = foofab.const_array();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(cross || tensorop || Gpu::notInLaunchRegion(),
                                     "non-cross stencil not support for gpu");

    const int hidden_direction = hiddenDirection();

#ifdef AMREX_USE_GPU
    if ((cross || tensorop) && Gpu::inLaunchRegion())
    {
        Vector<ABCTag> tags;
        tags.reserve(in.local_size()*AMREX_SPACEDIM*ncomp);

        for (MFIter mfi(in); mfi.isValid(); ++mfi) {
            const Box& vbx = mfi.validbox();
            const auto& iofab = in.array(mfi);
            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (idim != hidden_direction) {
                    const Orientation olo(idim,Orientation::low);
                    const Orientation ohi(idim,Orientation::high);
                    const auto& bvlo = (bndry != nullptr) ?
                        bndry->bndryValues(olo).const_array(mfi) : foo;
                    const auto& bvhi = (bndry != nullptr) ?
                        bndry->bndryValues(ohi).const_array(mfi) : foo;
                    for (int icomp = 0; icomp < ncomp; ++icomp) {
                        tags.emplace_back(ABCTag{iofab, bvlo, bvhi,
                                                 maskvals[olo].const_array(mfi),
                                                 maskvals[ohi].const_array(mfi),
                                                 bdlv[icomp][olo], bdlv[icomp][ohi],
                                                 amrex::adjCell(vbx,olo),
                                                 bdcv[icomp][olo], bdcv[icomp][ohi],
                                                 vbx.length(idim), icomp, idim});
                    }
                }
            }
        }

        ParallelFor(tags,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, ABCTag const& tag) noexcept
        {
            if (tag.dir == 0)
            {
                mllinop_apply_bc_x(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dxi, flagbc, tag.comp);
                mllinop_apply_bc_x(1, i+tag.blen+1, j, k, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dxi, flagbc, tag.comp);
            }
#if (AMREX_SPACEDIM > 1)
            else
#if (AMREX_SPACEDIM > 2)
            if (tag.dir == 1)
#endif
            {
                mllinop_apply_bc_y(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dyi, flagbc, tag.comp);
                mllinop_apply_bc_y(1, i, j+tag.blen+1, k, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dyi, flagbc, tag.comp);
            }
#if (AMREX_SPACEDIM > 2)
            else {
                mllinop_apply_bc_z(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dzi, flagbc, tag.comp);
                mllinop_apply_bc_z(1, i, j, k+tag.blen+1, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dzi, flagbc, tag.comp);
            }
#endif
#endif
        });
    } else
#endif
    if (cross || tensorop)
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(in, mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx   = mfi.validbox();
            const auto& iofab = in.array(mfi);

            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                if (hidden_direction == idim) continue;
                const Orientation olo(idim,Orientation::low);
                const Orientation ohi(idim,Orientation::high);
                const Box blo = amrex::adjCellLo(vbx, idim);
                const Box bhi = amrex::adjCellHi(vbx, idim);
                const int blen = vbx.length(idim);
                const auto& mlo = maskvals[olo].array(mfi);
                const auto& mhi = maskvals[ohi].array(mfi);
                const auto& bvlo = (bndry != nullptr) ? bndry->bndryValues(olo).const_array(mfi) : foo;
                const auto& bvhi = (bndry != nullptr) ? bndry->bndryValues(ohi).const_array(mfi) : foo;
                for (int icomp = 0; icomp < ncomp; ++icomp) {
                    const BoundCond bctlo = bdcv[icomp][olo];
                    const BoundCond bcthi = bdcv[icomp][ohi];
                    const Real bcllo = bdlv[icomp][olo];
                    const Real bclhi = bdlv[icomp][ohi];
                    if (idim == 0) {
                        mllinop_apply_bc_x(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dxi, flagbc, icomp);
                        mllinop_apply_bc_x(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dxi, flagbc, icomp);
                    } else if (idim == 1) {
                        mllinop_apply_bc_y(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dyi, flagbc, icomp);
                        mllinop_apply_bc_y(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dyi, flagbc, icomp);
                    } else {
                        mllinop_apply_bc_z(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dzi, flagbc, icomp);
                        mllinop_apply_bc_z(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dzi, flagbc, icomp);
                    }
                }
            }
        }
    }
    else
    {
#ifdef BL_NO_FORT
        amrex::Abort("amrex_mllinop_apply_bc not available when BL_NO_FORT=TRUE");
#else
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(in, mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx   = mfi.validbox();

            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            const RealTuple & bdl = bdlv[0];
            const BCTuple   & bdc = bdcv[0];

            for (OrientationIter oitr; oitr; ++oitr)
            {
                const Orientation ori = oitr();

                int  cdr = ori;
                Real bcl = bdl[ori];
                int  bct = bdc[ori];

                const FArrayBox& fsfab = (bndry != nullptr) ? bndry->bndryValues(ori)[mfi] : foofab;

                const Mask& m = maskvals[ori][mfi];

                amrex_mllinop_apply_bc(BL_TO_FORTRAN_BOX(vbx),
                                       BL_TO_FORTRAN_ANYD(in[mfi]),
                                       BL_TO_FORTRAN_ANYD(m),
                                       cdr, bct, bcl,
                                       BL_TO_FORTRAN_ANYD(fsfab),
                                       maxorder, dxinv, flagbc, ncomp, cross);
            }
        }
#endif
    }
}